

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrinput.cc
# Opt level: O2

void __thiscall ExrInput::~ExrInput(ExrInput *this)

{
  if (((this->image).width != 0) && ((this->image).height != 0)) {
    FreeEXRImage(&this->image);
  }
  FreeEXRHeader(&this->header);
  free(this->err);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->exrBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ImageInput::~ImageInput(&this->super_ImageInput);
  return;
}

Assistant:

~ExrInput() {
        // FreeEXRVersion(&version); // No need to call, no such function
        if (image.width != 0 && image.height != 0) {
            FreeEXRImage(&image);
        }
        FreeEXRHeader(&header);
        FreeEXRErrorMessage(err);
    }